

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clientversion.cpp
# Opt level: O3

string * FormatFullVersion_abi_cxx11_(void)

{
  long lVar1;
  int iVar2;
  string *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (FormatFullVersion[abi:cxx11]()::CLIENT_BUILD_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&FormatFullVersion[abi:cxx11]()::CLIENT_BUILD_abi_cxx11_);
    if (iVar2 != 0) {
      FormatFullVersion[abi:cxx11]()::CLIENT_BUILD_abi_cxx11_._M_dataplus._M_p =
           (pointer)&FormatFullVersion[abi:cxx11]()::CLIENT_BUILD_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&FormatFullVersion[abi:cxx11]()::CLIENT_BUILD_abi_cxx11_,
                 "v28.99.0-36ad9516dbd6","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &FormatFullVersion[abi:cxx11]()::CLIENT_BUILD_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&FormatFullVersion[abi:cxx11]()::CLIENT_BUILD_abi_cxx11_);
    }
  }
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::string::_M_construct<char*>();
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string FormatFullVersion()
{
    static const std::string CLIENT_BUILD(BUILD_DESC BUILD_SUFFIX);
    return CLIENT_BUILD;
}